

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O0

void __thiscall
async_simple::FutureState<std::error_code>::setResult
          (FutureState<std::error_code> *this,Try<std::error_code> *value)

{
  State SVar1;
  bool bVar2;
  undefined8 in_RSI;
  FutureState<std::error_code> *in_RDI;
  atomic<async_simple::detail::State> *unaff_retaddr;
  State state;
  bool in_stack_0000009f;
  FutureState<std::error_code> *in_stack_000000a0;
  Try<std::error_code> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  State SVar3;
  FutureState<std::error_code> *__e;
  
  __e = in_RDI;
  hasResult(in_RDI);
  logicAssert(SUB81((ulong)in_RSI >> 0x38,0),
              (char *)CONCAT17(in_stack_ffffffffffffffef,
                               CONCAT16(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8)));
  Try<std::error_code>::operator=((Try<std::error_code> *)in_RDI,in_stack_ffffffffffffffd8);
  SVar1 = std::atomic<async_simple::detail::State>::load(&in_RDI->_state,acquire);
  SVar3 = SVar1;
  if (SVar1 == START) {
    bVar2 = std::atomic<async_simple::detail::State>::compare_exchange_strong
                      (unaff_retaddr,(State *)__e,(State)((ulong)in_RSI >> 0x38),
                       (memory_order)in_RSI);
    if (bVar2) {
      return;
    }
  }
  else if (SVar1 != ONLY_CONTINUATION) goto LAB_001ab70e;
  bVar2 = std::atomic<async_simple::detail::State>::compare_exchange_strong
                    (unaff_retaddr,(State *)__e,(State)((ulong)in_RSI >> 0x38),(memory_order)in_RSI)
  ;
  if (bVar2) {
    scheduleContinuation(in_stack_000000a0,in_stack_0000009f);
    return;
  }
LAB_001ab70e:
  logicAssert(SUB81((ulong)in_RSI >> 0x38,0),
              (char *)CONCAT17(SVar3,CONCAT16(SVar1,in_stack_ffffffffffffffe8)));
  return;
}

Assistant:

void setResult(Try<T>&& value) {
#if !defined(__GNUC__) || __GNUC__ < 12
        // GCC 12 issues a spurious uninitialized-var warning.
        // See details: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=109448
        logicAssert(!hasResult(), "FutureState already has a result");
#endif
        _try_value = std::move(value);

        auto state = _state.load(std::memory_order_acquire);
        switch (state) {
            case detail::State::START:
                if (_state.compare_exchange_strong(state,
                                                   detail::State::ONLY_RESULT,
                                                   std::memory_order_release)) {
                    return;
                }
                // state has already transfered, fallthrough
                assert(_state.load(std::memory_order_relaxed) ==
                       detail::State::ONLY_CONTINUATION);
            case detail::State::ONLY_CONTINUATION:
                if (_state.compare_exchange_strong(state, detail::State::DONE,
                                                   std::memory_order_release)) {
                    scheduleContinuation(false);
                    return;
                }
            default:
                logicAssert(false, "State Transfer Error");
        }
    }